

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_flip(void **param_1)

{
  Roaring r2_4;
  Roaring r1_5;
  Roaring r1_4;
  Roaring r2_3;
  Roaring r1_3;
  Roaring r2_2;
  Roaring r1_2;
  Roaring r2_1;
  Roaring r1_1;
  Roaring r2;
  Roaring r1;
  undefined4 in_stack_fffffffffffffdc8;
  int in_stack_fffffffffffffdcc;
  Roaring *in_stack_fffffffffffffdd0;
  Roaring *pRVar1;
  char *in_stack_fffffffffffffdd8;
  Roaring *expression;
  unsigned_long in_stack_fffffffffffffde0;
  undefined1 *n;
  uint uVar2;
  uint in_stack_fffffffffffffdfc;
  Roaring local_1a8;
  undefined1 local_180 [40];
  undefined1 local_158 [40];
  undefined1 local_130 [8];
  undefined1 local_108 [40];
  Roaring local_e0;
  undefined1 local_b8 [40];
  undefined1 local_90 [56];
  undefined1 local_58 [88];
  
  roaring::Roaring::Roaring(in_stack_fffffffffffffdd0);
  roaring::Roaring::flip
            (in_stack_fffffffffffffdd0,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
             ,0x10e9f5);
  roaring::Roaring::bitmapOf((size_t)local_58,3,2,3,4);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffdd0,
             (Roaring *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  _assert_true(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0
               ,in_stack_fffffffffffffdcc);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffdd0);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffdd0);
  roaring::Roaring::bitmapOf((size_t)local_90,3,1,3);
  roaring::Roaring::flip
            (in_stack_fffffffffffffdd0,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
             ,0x10eab3);
  roaring::Roaring::bitmapOf((size_t)local_b8,4,1,2,4,6);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffdd0,
             (Roaring *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  _assert_true(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0
               ,in_stack_fffffffffffffdcc);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffdd0);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffdd0);
  pRVar1 = &local_e0;
  roaring::Roaring::bitmapOf((size_t)pRVar1,2,1,3);
  roaring::Roaring::flip
            (in_stack_fffffffffffffdd0,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
             ,0x10eb6d);
  roaring::Roaring::bitmapOf((size_t)local_108,3,0,2,4);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffdd0,
             (Roaring *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  _assert_true(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0
               ,in_stack_fffffffffffffdcc);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffdd0);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffdd0);
  in_stack_fffffffffffffdfc = in_stack_fffffffffffffdfc & 0xffffff;
  uVar2 = 3;
  roaring::Roaring::bitmapOf((size_t)local_130,2,1);
  roaring::Roaring::flip
            (in_stack_fffffffffffffdd0,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
             ,0x10ec26);
  roaring::Roaring::bitmapOf((size_t)local_158,2,2,(ulong)uVar2);
  roaring::Roaring::operator==
            (in_stack_fffffffffffffdd0,
             (Roaring *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  _assert_true(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0
               ,in_stack_fffffffffffffdcc);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffdd0);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffdd0);
  n = local_180;
  roaring::Roaring::bitmapOf((size_t)n,1,0xffffffff);
  roaring::Roaring::flip
            (in_stack_fffffffffffffdd0,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8)
             ,0x10eccc);
  roaring::Roaring::isEmpty(in_stack_fffffffffffffdd0);
  _assert_true((unsigned_long)n,in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
               in_stack_fffffffffffffdcc);
  roaring::Roaring::~Roaring(in_stack_fffffffffffffdd0);
  expression = &local_1a8;
  roaring::Roaring::bitmapOf((size_t)expression,2,2,3);
  roaring::Roaring::Roaring(pRVar1,(Roaring *)CONCAT44(in_stack_fffffffffffffdfc,uVar2));
  pRVar1 = &local_1a8;
  roaring::Roaring::flip
            (pRVar1,CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),0x10ed50);
  roaring::Roaring::operator==
            (pRVar1,(Roaring *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  _assert_true((unsigned_long)n,(char *)expression,(char *)pRVar1,in_stack_fffffffffffffdcc);
  roaring::Roaring::~Roaring(pRVar1);
  roaring::Roaring::~Roaring(pRVar1);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_flip) {
    {
        // flipping an empty map works as expected
        Roaring r1;
        r1.flip(2, 5);
        Roaring r2 = Roaring::bitmapOf(3, 2, 3, 4);
        assert_true(r1 == r2);
    }
    {
        // nothing is affected outside of the given range
        Roaring r1 = Roaring::bitmapOf(3, 1, 3, 6);
        r1.flip(2, 5);
        Roaring r2 = Roaring::bitmapOf(4, 1, 2, 4, 6);
        assert_true(r1 == r2);
    }
    {
        // given range can go outside of existing range
        Roaring r1 = Roaring::bitmapOf(2, 1, 3);
        r1.flip(0, 5);
        Roaring r2 = Roaring::bitmapOf(3, 0, 2, 4);
        assert_true(r1 == r2);
    }
    {
        // range end is exclusive
        Roaring r1 = Roaring::bitmapOf(2, 1, 3);
        r1.flip(1, 3);
        Roaring r2 = Roaring::bitmapOf(2, 2, 3);
        assert_true(r1 == r2);
    }
    {
        // uint32 max can be flipped
        Roaring r1 = Roaring::bitmapOf(1, uint32_max);
        r1.flip(uint32_max, static_cast<uint64_t>(uint32_max) + 1);
        assert_true(r1.isEmpty());
    }
    {
        // empty range does nothing
        Roaring r1 = Roaring::bitmapOf(2, 2, 3);
        Roaring r2 = r1;
        r1.flip(2, 2);
        assert_true(r1 == r2);
    }
}